

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComparatorDisposer.cpp
# Opt level: O2

void __thiscall
ApprovalTests::ComparatorDisposer::ComparatorDisposer
          (ComparatorDisposer *this,ComparatorContainer *comparators_,string *extensionWithDot,
          shared_ptr<ApprovalTests::ApprovalComparator> *previousComparator_,
          shared_ptr<ApprovalTests::ApprovalComparator> *newComparator)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2> *this_00;
  
  this->isActive = true;
  this->comparators = comparators_;
  ::std::__cxx11::string::string((string *)&this->ext_,(string *)extensionWithDot);
  (this->previousComparator).
  super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (previousComparator_->
           super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  p_Var2 = (previousComparator_->
           super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (previousComparator_->
  super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->previousComparator).
  super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->previousComparator).
  super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  (previousComparator_->
  super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  this_00 = &::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ApprovalTests::ApprovalComparator>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ApprovalTests::ApprovalComparator>_>_>_>
             ::operator[](comparators_,extensionWithDot)->
             super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>;
  ::std::__shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>::operator=
            (this_00,&newComparator->
                      super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>
            );
  return;
}

Assistant:

ComparatorDisposer::ComparatorDisposer(
        ComparatorContainer& comparators_,
        const std::string& extensionWithDot,
        std::shared_ptr<ApprovalTests::ApprovalComparator> previousComparator_,
        std::shared_ptr<ApprovalTests::ApprovalComparator> newComparator)
        : comparators(comparators_)
        , ext_(extensionWithDot)
        , previousComparator(std::move(previousComparator_))
    {
        comparators_[extensionWithDot] = std::move(newComparator);
    }